

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

int conn_upkeep(Curl_easy *data,connectdata *conn,void *param)

{
  _func_uint_Curl_easy_ptr_connectdata_ptr_uint *p_Var1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  timediff_t tVar5;
  curltime newer;
  curltime older;
  
  uVar2 = (conn->keepalive).tv_sec;
  uVar3 = (conn->keepalive).tv_usec;
  older.tv_usec = uVar3;
  older.tv_sec = uVar2;
  newer._12_4_ = 0;
  newer._0_12_ = *param;
  older._12_4_ = 0;
  tVar5 = Curl_timediff(newer,older);
  if ((data->set).upkeep_interval_ms < tVar5) {
    Curl_attach_connection(data,conn);
    p_Var1 = conn->handler->connection_check;
    if (p_Var1 == (_func_uint_Curl_easy_ptr_connectdata_ptr_uint *)0x0) {
      Curl_conn_keep_alive(data,conn,0);
    }
    else {
      (*p_Var1)(data,conn,2);
    }
    Curl_detach_connection(data);
    uVar4 = *(undefined8 *)((long)param + 8);
    (conn->keepalive).tv_sec = *param;
    *(undefined8 *)&(conn->keepalive).tv_usec = uVar4;
  }
  return 0;
}

Assistant:

static int conn_upkeep(struct Curl_easy *data,
                       struct connectdata *conn,
                       void *param)
{
  struct curltime *now = param;

  if(Curl_timediff(*now, conn->keepalive) <= data->set.upkeep_interval_ms)
    return 0;

  /* briefly attach for action */
  Curl_attach_connection(data, conn);
  if(conn->handler->connection_check) {
    /* Do a protocol-specific keepalive check on the connection. */
    conn->handler->connection_check(data, conn, CONNCHECK_KEEPALIVE);
  }
  else {
    /* Do the generic action on the FIRSTSOCKE filter chain */
    Curl_conn_keep_alive(data, conn, FIRSTSOCKET);
  }
  Curl_detach_connection(data);

  conn->keepalive = *now;
  return 0; /* continue iteration */
}